

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depspawn.cpp
# Opt level: O3

void __thiscall depspawn::internal::arg_info::solve_overlap(arg_info *this,arg_info *other)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  arg_info *paVar4;
  bool bVar5;
  arg_info *local_8;
  
  bVar5 = this->wr;
  bVar3 = true;
  if (bVar5 == false) {
    bVar3 = other->wr;
  }
  uVar1 = this->size;
  uVar2 = other->size;
  if (uVar1 - uVar2 == 0) {
    other->wr = bVar3;
    paVar4 = (arg_info *)Pool._32_8_;
    do {
      this->next = paVar4;
      LOCK();
      bVar5 = paVar4 != (arg_info *)Pool._32_8_;
      uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
      if (bVar5) {
        paVar4 = (arg_info *)Pool._32_8_;
        uVar1 = Pool._32_8_;
      }
      Pool._32_8_ = uVar1;
      UNLOCK();
    } while (bVar5);
  }
  else {
    if (uVar1 < uVar2) {
      bVar5 = other->wr;
      paVar4 = (arg_info *)Pool._32_8_;
      if (bVar3 == bVar5) {
        do {
          this->next = paVar4;
          LOCK();
          bVar5 = paVar4 != (arg_info *)Pool._32_8_;
          uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
          if (bVar5) {
            paVar4 = (arg_info *)Pool._32_8_;
            uVar1 = Pool._32_8_;
          }
          Pool._32_8_ = uVar1;
          UNLOCK();
        } while (bVar5);
        return;
      }
      this->addr = this->addr + uVar1;
      this->size = uVar2 - uVar1;
      this->wr = bVar5;
      other->size = uVar1;
      other->wr = bVar3;
    }
    else {
      if (bVar5 == bVar3) {
        other->wr = bVar5;
        other->size = uVar1;
        paVar4 = (arg_info *)Pool._32_8_;
        do {
          this->next = paVar4;
          LOCK();
          bVar5 = paVar4 != (arg_info *)Pool._32_8_;
          uVar1 = ((ulong)paVar4 & 0xffff000000000000) + 0x1000000000000 | (ulong)this;
          if (bVar5) {
            paVar4 = (arg_info *)Pool._32_8_;
            uVar1 = Pool._32_8_;
          }
          Pool._32_8_ = uVar1;
          UNLOCK();
        } while (bVar5);
        return;
      }
      this->addr = this->addr + uVar2;
      this->size = uVar1 - uVar2;
    }
    local_8 = other;
    insert_in_arglist(this,&local_8);
  }
  return;
}

Assistant:

void arg_info::solve_overlap(arg_info *other)
    { size_t tmp_size;
      
      //fprintf(stderr, "%zu [%d %zu] [d %zu]\n", addr, other->wr, other->size, wr, size);
      
      const bool orwr = wr || other->wr;
      
      if(size == other->size) {
	other->wr = orwr;
	Pool.free(this);
      } else if (size < other->size) {
	
	if(orwr == other->wr)
	  Pool.free(this);
	else {
	  tmp_size = size;
	  
	  addr += size;
	  size = other->size - size;
	  wr = other->wr; //should be false
	  
	  other->size = tmp_size;
	  other->wr = orwr; //should be true
	  
	  insert_in_arglist(other);
	}
	
      } else { //size > other->size
	
	if(orwr == wr) {
	  other->wr = orwr;
	  other->size = size;
	  Pool.free(this);
	} else { //Should be other->wr = true, this->wr = false
	  tmp_size = other->size;
	  
	  addr += tmp_size;
	  size -= tmp_size;
	  
	  insert_in_arglist(other);
	}
	
      }
      
    }